

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

int BackwardRefsClone(VP8LBackwardRefs *from,VP8LBackwardRefs *to)

{
  PixOrCopyBlock *pPVar1;
  
  if (to->tail != (PixOrCopyBlock **)0x0) {
    *to->tail = to->free_blocks;
  }
  to->free_blocks = to->refs;
  to->tail = &to->refs;
  to->last_block = (PixOrCopyBlock *)0x0;
  to->refs = (PixOrCopyBlock *)0x0;
  while( true ) {
    if (from == (VP8LBackwardRefs *)0x0) {
      return 1;
    }
    pPVar1 = BackwardRefsNewBlock(to);
    if (pPVar1 == (PixOrCopyBlock *)0x0) break;
    memcpy(pPVar1->start,from->refs,(long)*(int *)&from->tail << 3);
    pPVar1->size = *(int *)&from->tail;
    from = *(VP8LBackwardRefs **)from;
  }
  return 0;
}

Assistant:

static int BackwardRefsClone(const VP8LBackwardRefs* const from,
                             VP8LBackwardRefs* const to) {
  const PixOrCopyBlock* block_from = from->refs;
  VP8LClearBackwardRefs(to);
  while (block_from != NULL) {
    PixOrCopyBlock* const block_to = BackwardRefsNewBlock(to);
    if (block_to == NULL) return 0;
    memcpy(block_to->start, block_from->start,
           block_from->size * sizeof(PixOrCopy));
    block_to->size = block_from->size;
    block_from = block_from->next;
  }
  return 1;
}